

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O2

void print_token(FILE *out,token *token)

{
  ulong uVar1;
  
  if (token != (token *)0x0) {
    for (uVar1 = 0; uVar1 < token->data_size; uVar1 = uVar1 + 1) {
      fputc((int)token->data[uVar1],(FILE *)out);
    }
  }
  return;
}

Assistant:

void print_token(FILE *out,struct token *token)
{
	size_t i;
//	fprintf(out,"[");
	if(token==NULL)return;
	for(i=0;i<token->data_size;++i)
	{
		fprintf(out,"%c",token->data[i]);
	}
//	fprintf(out,"]");
}